

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O1

bool __thiscall
absl::numbers_internal::safe_strto32_base
          (numbers_internal *this,string_view text,int32_t *value,int base)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int *piVar5;
  numbers_internal *pnVar6;
  uint uVar7;
  bool local_1d;
  int local_1c;
  string_view local_18;
  
  piVar5 = (int *)text.length_;
  local_18.length_ = (size_type)text.ptr_;
  local_1c = (int)value;
  *piVar5 = 0;
  local_18.ptr_ = (char *)this;
  bVar3 = anon_unknown_0::safe_parse_sign_and_base(&local_18,&local_1c,&local_1d);
  if (!bVar3) {
    return false;
  }
  if (local_1d == false) {
    if ((long)local_1c < 0) {
      __assert_fail("base >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/strings/numbers.cc"
                    ,0x319,
                    "bool absl::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, IntType *) [IntType = int]"
                   );
    }
    bVar3 = (long)local_18.length_ < 1;
    if (0 < (long)local_18.length_) {
      iVar1 = *(int *)((anonymous_namespace)::LookupTables<int>::kVmaxOverBase + (long)local_1c * 4)
      ;
      pnVar6 = (numbers_internal *)(local_18.length_ + (long)local_18.ptr_);
      iVar4 = 0;
      do {
        uVar7 = (uint)(char)(anonymous_namespace)::kAsciiToInt[(byte)*local_18.ptr_];
        if ((int)uVar7 < local_1c) {
          if ((iVar1 < iVar4) || (iVar4 = iVar4 * local_1c, (int)(uVar7 ^ 0x7fffffff) < iVar4)) {
            *piVar5 = 0x7fffffff;
            goto LAB_002341f3;
          }
          iVar4 = iVar4 + uVar7;
          bVar2 = true;
        }
        else {
          *piVar5 = iVar4;
LAB_002341f3:
          bVar2 = false;
        }
        if (!bVar2) {
          return bVar3;
        }
        local_18.ptr_ = (char *)((numbers_internal *)local_18.ptr_ + 1);
        bVar3 = local_18.ptr_ >= pnVar6;
      } while (local_18.ptr_ < pnVar6);
      goto LAB_00234212;
    }
  }
  else {
    bVar3 = (long)local_18.length_ < 1;
    if (0 < (long)local_18.length_) {
      iVar1 = *(int *)((anonymous_namespace)::LookupTables<int>::kVminOverBase + (long)local_1c * 4)
      ;
      pnVar6 = (numbers_internal *)(local_18.length_ + (long)local_18.ptr_);
      iVar4 = 0;
      do {
        uVar7 = (uint)(char)(anonymous_namespace)::kAsciiToInt[(byte)*local_18.ptr_];
        if ((int)uVar7 < local_1c) {
          if ((iVar4 < iVar1) || (iVar4 = iVar4 * local_1c, iVar4 < (int)(uVar7 | 0x80000000))) {
            *piVar5 = -0x80000000;
            goto LAB_00234162;
          }
          iVar4 = iVar4 - uVar7;
          bVar2 = true;
        }
        else {
          *piVar5 = iVar4;
LAB_00234162:
          bVar2 = false;
        }
        if (!bVar2) {
          return bVar3;
        }
        local_18.ptr_ = (char *)((numbers_internal *)local_18.ptr_ + 1);
        bVar3 = local_18.ptr_ >= pnVar6;
      } while (local_18.ptr_ < pnVar6);
      goto LAB_00234212;
    }
  }
  bVar3 = (long)local_18.length_ < 1;
  iVar4 = 0;
LAB_00234212:
  *piVar5 = iVar4;
  return bVar3;
}

Assistant:

bool safe_strto32_base(absl::string_view text, int32_t* value, int base) {
  return safe_int_internal<int32_t>(text, value, base);
}